

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void MergeRGBRow_C(uint8_t *src_r,uint8_t *src_g,uint8_t *src_b,uint8_t *dst_rgb,int width)

{
  int x;
  int width_local;
  uint8_t *dst_rgb_local;
  uint8_t *src_b_local;
  uint8_t *src_g_local;
  uint8_t *src_r_local;
  
  dst_rgb_local = dst_rgb;
  for (x = 0; x < width; x = x + 1) {
    *dst_rgb_local = src_r[x];
    dst_rgb_local[1] = src_g[x];
    dst_rgb_local[2] = src_b[x];
    dst_rgb_local = dst_rgb_local + 3;
  }
  return;
}

Assistant:

void MergeRGBRow_C(const uint8_t* src_r,
                   const uint8_t* src_g,
                   const uint8_t* src_b,
                   uint8_t* dst_rgb,
                   int width) {
  int x;
  for (x = 0; x < width; ++x) {
    dst_rgb[0] = src_r[x];
    dst_rgb[1] = src_g[x];
    dst_rgb[2] = src_b[x];
    dst_rgb += 3;
  }
}